

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O3

bool google::protobuf::compiler::cpp::HasExtensionFromFile
               (Message *msg,FileDescriptor *file,Options *options,bool *has_opt_codesize_extension)

{
  byte bVar1;
  FieldDescriptor *this;
  FileOptions_OptimizeMode FVar2;
  int iVar3;
  Descriptor *pDVar4;
  Message *pMVar5;
  Nonnull<const_char_*> failure_msg;
  bool bVar6;
  Reflection *this_00;
  pointer ppFVar7;
  int i;
  int index;
  Metadata MVar8;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_68;
  pointer local_48;
  LogMessageFatal local_40;
  
  local_68.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  MVar8 = Message::GetMetadata(msg);
  this_00 = MVar8.reflection;
  Reflection::ListFields(this_00,msg,&local_68);
  local_48 = local_68.
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  ppFVar7 = local_68.
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (local_68.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_68.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar6 = false;
  }
  else {
    do {
      this = *ppFVar7;
      pDVar4 = FieldDescriptor::message_type(this);
      if (pDVar4 != (Descriptor *)0x0) {
        if ((this->field_0x1 & 8) != 0) {
          pDVar4 = FieldDescriptor::message_type(this);
          if (pDVar4->file_ != file) {
            if ((has_opt_codesize_extension != (bool *)0x0) &&
               (FVar2 = GetOptimizeFor(pDVar4->file_,options,(bool *)0x0),
               FVar2 == FileOptions_OptimizeMode_CODE_SIZE)) {
              *has_opt_codesize_extension = true;
            }
            goto LAB_001b3b76;
          }
LAB_001b3c12:
          bVar6 = true;
          goto LAB_001b3c1d;
        }
LAB_001b3b76:
        bVar1 = this->field_0x1;
        bVar6 = (bool)((bVar1 & 0x20) >> 5);
        if (0xbf < bVar1 != bVar6) {
          failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                  (bVar6,0xbf < bVar1,
                                   "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    (&local_40,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,0xb54,failure_msg);
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_40);
        }
        if ((bVar1 & 0x20) == 0) {
          pMVar5 = Reflection::GetMessage(this_00,msg,this,(MessageFactory *)0x0);
          bVar6 = HasExtensionFromFile(pMVar5,file,options,has_opt_codesize_extension);
          if (bVar6) goto LAB_001b3c12;
        }
        else {
          index = 0;
          while (iVar3 = Reflection::FieldSize(this_00,msg,this), index < iVar3) {
            pMVar5 = Reflection::GetRepeatedMessage(this_00,msg,this,index);
            bVar6 = HasExtensionFromFile(pMVar5,file,options,has_opt_codesize_extension);
            index = index + 1;
            if (bVar6) goto LAB_001b3c12;
          }
        }
      }
      ppFVar7 = ppFVar7 + 1;
    } while (ppFVar7 != local_48);
    bVar6 = false;
  }
LAB_001b3c1d:
  if (local_68.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar6;
}

Assistant:

static bool HasExtensionFromFile(const Message& msg, const FileDescriptor* file,
                                 const Options& options,
                                 bool* has_opt_codesize_extension) {
  std::vector<const FieldDescriptor*> fields;
  auto reflection = msg.GetReflection();
  reflection->ListFields(msg, &fields);
  for (auto field : fields) {
    const auto* field_msg = field->message_type();
    if (field_msg == nullptr) {
      // It so happens that enums Is_Valid are still generated so enums work.
      // Only messages have potential problems.
      continue;
    }
    // If this option has an extension set AND that extension is defined in the
    // same file we have bootstrap problem.
    if (field->is_extension()) {
      const auto* msg_extension_file = field->message_type()->file();
      if (msg_extension_file == file) return true;
      if (has_opt_codesize_extension &&
          GetOptimizeFor(msg_extension_file, options) ==
              FileOptions::CODE_SIZE) {
        *has_opt_codesize_extension = true;
      }
    }
    // Recurse in this field to see if there is a problem in there
    if (field->is_repeated()) {
      for (int i = 0; i < reflection->FieldSize(msg, field); i++) {
        if (HasExtensionFromFile(reflection->GetRepeatedMessage(msg, field, i),
                                 file, options, has_opt_codesize_extension)) {
          return true;
        }
      }
    } else {
      if (HasExtensionFromFile(reflection->GetMessage(msg, field), file,
                               options, has_opt_codesize_extension)) {
        return true;
      }
    }
  }
  return false;
}